

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecondH10BeatsFirst.h
# Opt level: O0

int __thiscall
SecondH10BeatsFirst::getHighestCardID
          (SecondH10BeatsFirst *this,int previous,vector<Card,_std::allocator<Card>_> *cards)

{
  bool bVar1;
  const_iterator __first;
  difference_type dVar2;
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_78;
  Card local_70;
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_68;
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_60;
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_58;
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> second;
  Card local_48;
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_40;
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_38;
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_30;
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> first;
  vector<Card,_std::allocator<Card>_> *cards_local;
  int previous_local;
  SecondH10BeatsFirst *this_local;
  
  first._M_current = (Card *)cards;
  local_38._M_current = (Card *)std::vector<Card,_std::allocator<Card>_>::begin(cards);
  local_40._M_current = (Card *)std::vector<Card,_std::allocator<Card>_>::end(first._M_current);
  Card::Card(&local_48,HEARTS,TEN);
  local_30 = std::
             find<__gnu_cxx::__normal_iterator<Card_const*,std::vector<Card,std::allocator<Card>>>,Card>
                       (local_38,local_40,&local_48);
  second._M_current = (Card *)std::vector<Card,_std::allocator<Card>_>::end(first._M_current);
  bVar1 = __gnu_cxx::operator!=(&local_30,&second);
  this_local._4_4_ = previous;
  if (bVar1) {
    local_60 = __gnu_cxx::__normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_>
               ::operator+(&local_30,1);
    local_68._M_current = (Card *)std::vector<Card,_std::allocator<Card>_>::end(first._M_current);
    Card::Card(&local_70,HEARTS,TEN);
    local_58 = std::
               find<__gnu_cxx::__normal_iterator<Card_const*,std::vector<Card,std::allocator<Card>>>,Card>
                         (local_60,local_68,&local_70);
    local_78._M_current = (Card *)std::vector<Card,_std::allocator<Card>_>::end(first._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_58,&local_78);
    if (bVar1) {
      __first = std::vector<Card,_std::allocator<Card>_>::begin(first._M_current);
      dVar2 = std::
              distance<__gnu_cxx::__normal_iterator<Card_const*,std::vector<Card,std::allocator<Card>>>>
                        ((__normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_>
                         )__first._M_current,local_58);
      this_local._4_4_ = (int)dVar2;
    }
  }
  return this_local._4_4_;
}

Assistant:

int getHighestCardID(int previous, const std::vector<Card> &cards) override{
        auto first = std::find(cards.begin(), cards.end(), Card(Suit::HEARTS, CardValue::TEN));
        if(first != cards.end()){
           auto second = std::find(first + 1, cards.end(), Card(Suit::HEARTS, CardValue::TEN));
           if(second != cards.end()) {
               return (int) std::distance(cards.begin(), second);
           }
        }
        return previous;
    }